

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::Eltwise_x86_avx2::forward
          (Eltwise_x86_avx2 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  uint uVar6;
  int iVar7;
  Mat *m;
  Mat *this_00;
  size_t sVar8;
  _func_int **pp_Var9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  _func_int *p_Var15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  pointer pMVar18;
  ulong uVar19;
  pointer pMVar20;
  ulong uVar21;
  ulong uVar22;
  void *pvVar23;
  void *pvVar24;
  int iVar25;
  long lVar26;
  void *pvVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar44 [64];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar25 = m->elempack;
  uVar6 = m->c;
  uVar22 = (ulong)uVar6;
  iVar30 = m->h * m->w;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  pvVar23 = this_00->data;
  if (pvVar23 == (void *)0x0) {
    return -100;
  }
  sVar8 = this_00->cstep;
  if ((long)this_00->c * sVar8 != 0) {
    pp_Var9 = this->_vptr_Eltwise_x86_avx2;
    iVar7 = *(int *)(&this->field_0xd0 + (long)pp_Var9[-3]);
    if (iVar25 == 4) {
      if (iVar7 == 0) {
        pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (0 < (int)uVar6) {
          uVar21 = 0;
          do {
            if (0 < iVar30) {
              sVar8 = this_00->cstep;
              sVar10 = pMVar20[1].cstep;
              sVar11 = this_00->elemsize;
              pvVar23 = this_00->data;
              sVar12 = pMVar20[1].elemsize;
              pvVar24 = pMVar20[1].data;
              sVar13 = m->cstep;
              sVar14 = m->elemsize;
              pvVar27 = m->data;
              lVar26 = 0;
              iVar25 = iVar30;
              do {
                pfVar1 = (float *)((long)pvVar24 + lVar26 + sVar10 * sVar12 * uVar21);
                pfVar2 = (float *)((long)pvVar27 + lVar26 + sVar13 * sVar14 * uVar21);
                auVar33._0_4_ = *pfVar1 * *pfVar2;
                auVar33._4_4_ = pfVar1[1] * pfVar2[1];
                auVar33._8_4_ = pfVar1[2] * pfVar2[2];
                auVar33._12_4_ = pfVar1[3] * pfVar2[3];
                *(undefined1 (*) [16])((long)pvVar23 + lVar26 + sVar8 * sVar11 * uVar21) = auVar33;
                lVar26 = lVar26 + 0x10;
                iVar25 = iVar25 + -1;
              } while (iVar25 != 0);
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar22);
          pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        }
        pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (2 < (ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7)) {
          uVar21 = 2;
          do {
            if (0 < (int)uVar6) {
              pMVar20 = pMVar20 + uVar21;
              uVar19 = 0;
              do {
                if (0 < iVar30) {
                  lVar26 = this_00->cstep * this_00->elemsize * uVar19;
                  pvVar23 = this_00->data;
                  sVar8 = pMVar20->cstep;
                  sVar10 = pMVar20->elemsize;
                  pvVar24 = pMVar20->data;
                  lVar28 = 0;
                  iVar25 = iVar30;
                  do {
                    pfVar1 = (float *)((long)pvVar24 + lVar28 + sVar8 * sVar10 * uVar19);
                    pfVar2 = (float *)((long)pvVar23 + lVar28 + lVar26);
                    auVar34._0_4_ = *pfVar1 * *pfVar2;
                    auVar34._4_4_ = pfVar1[1] * pfVar2[1];
                    auVar34._8_4_ = pfVar1[2] * pfVar2[2];
                    auVar34._12_4_ = pfVar1[3] * pfVar2[3];
                    *(undefined1 (*) [16])((long)pvVar23 + lVar28 + lVar26) = auVar34;
                    lVar28 = lVar28 + 0x10;
                    iVar25 = iVar25 + -1;
                  } while (iVar25 != 0);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar22);
              pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < (ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      p_Var15 = pp_Var9[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var15) == 1) {
        pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(int *)(&this->field_0x104 + (long)p_Var15) == 0) {
          if (0 < (int)uVar6) {
            uVar21 = 0;
            do {
              if (0 < iVar30) {
                sVar8 = this_00->cstep;
                sVar10 = pMVar20[1].cstep;
                sVar11 = this_00->elemsize;
                pvVar23 = this_00->data;
                sVar12 = pMVar20[1].elemsize;
                pvVar24 = pMVar20[1].data;
                sVar13 = m->cstep;
                sVar14 = m->elemsize;
                pvVar27 = m->data;
                lVar26 = 0;
                iVar25 = iVar30;
                do {
                  pfVar1 = (float *)((long)pvVar24 + lVar26 + sVar10 * sVar12 * uVar21);
                  pfVar2 = (float *)((long)pvVar27 + lVar26 + sVar13 * sVar14 * uVar21);
                  auVar36._0_4_ = *pfVar1 + *pfVar2;
                  auVar36._4_4_ = pfVar1[1] + pfVar2[1];
                  auVar36._8_4_ = pfVar1[2] + pfVar2[2];
                  auVar36._12_4_ = pfVar1[3] + pfVar2[3];
                  *(undefined1 (*) [16])((long)pvVar23 + lVar26 + sVar8 * sVar11 * uVar21) = auVar36
                  ;
                  lVar26 = lVar26 + 0x10;
                  iVar25 = iVar25 + -1;
                } while (iVar25 != 0);
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != uVar22);
            pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          }
          pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          if (2 < (ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7)) {
            uVar21 = 2;
            do {
              if (0 < (int)uVar6) {
                pMVar20 = pMVar20 + uVar21;
                uVar19 = 0;
                do {
                  if (0 < iVar30) {
                    lVar26 = this_00->cstep * this_00->elemsize * uVar19;
                    pvVar23 = this_00->data;
                    sVar8 = pMVar20->cstep;
                    sVar10 = pMVar20->elemsize;
                    pvVar24 = pMVar20->data;
                    lVar28 = 0;
                    iVar25 = iVar30;
                    do {
                      pfVar1 = (float *)((long)pvVar24 + lVar28 + sVar8 * sVar10 * uVar19);
                      pfVar2 = (float *)((long)pvVar23 + lVar28 + lVar26);
                      auVar37._0_4_ = *pfVar1 + *pfVar2;
                      auVar37._4_4_ = pfVar1[1] + pfVar2[1];
                      auVar37._8_4_ = pfVar1[2] + pfVar2[2];
                      auVar37._12_4_ = pfVar1[3] + pfVar2[3];
                      *(undefined1 (*) [16])((long)pvVar23 + lVar28 + lVar26) = auVar37;
                      lVar28 = lVar28 + 0x10;
                      iVar25 = iVar25 + -1;
                    } while (iVar25 != 0);
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar19 != uVar22);
                pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 < (ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7));
          }
        }
        else {
          if (0 < (int)uVar6) {
            fVar3 = **(float **)(&this->field_0xd8 + (long)p_Var15);
            fVar4 = (*(float **)(&this->field_0xd8 + (long)p_Var15))[1];
            auVar41._4_4_ = fVar4;
            auVar41._0_4_ = fVar4;
            auVar41._8_4_ = fVar4;
            auVar41._12_4_ = fVar4;
            uVar21 = 0;
            do {
              if (0 < iVar30) {
                sVar8 = this_00->cstep;
                sVar10 = pMVar20[1].cstep;
                sVar11 = this_00->elemsize;
                pvVar23 = this_00->data;
                sVar12 = pMVar20[1].elemsize;
                pvVar24 = pMVar20[1].data;
                sVar13 = m->cstep;
                sVar14 = m->elemsize;
                pvVar27 = m->data;
                lVar26 = 0;
                iVar25 = iVar30;
                do {
                  pfVar1 = (float *)((long)pvVar27 + lVar26 + sVar13 * sVar14 * uVar21);
                  auVar43._0_4_ = fVar3 * *pfVar1;
                  auVar43._4_4_ = fVar3 * pfVar1[1];
                  auVar43._8_4_ = fVar3 * pfVar1[2];
                  auVar43._12_4_ = fVar3 * pfVar1[3];
                  auVar33 = vfmadd231ps_fma(auVar43,auVar41,
                                            *(undefined1 (*) [16])
                                             ((long)pvVar24 + lVar26 + sVar10 * sVar12 * uVar21));
                  *(undefined1 (*) [16])((long)pvVar23 + lVar26 + sVar8 * sVar11 * uVar21) = auVar33
                  ;
                  lVar26 = lVar26 + 0x10;
                  iVar25 = iVar25 + -1;
                } while (iVar25 != 0);
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != uVar22);
            pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          }
          pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          if (2 < (ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7)) {
            uVar21 = 2;
            do {
              if (0 < (int)uVar6) {
                pMVar20 = pMVar20 + uVar21;
                uVar5 = *(undefined4 *)
                         (*(long *)(&this->field_0xd8 + (long)pp_Var9[-3]) + uVar21 * 4);
                auVar35._4_4_ = uVar5;
                auVar35._0_4_ = uVar5;
                auVar35._8_4_ = uVar5;
                auVar35._12_4_ = uVar5;
                uVar19 = 0;
                do {
                  if (0 < iVar30) {
                    lVar26 = this_00->cstep * this_00->elemsize * uVar19;
                    pvVar23 = this_00->data;
                    sVar8 = pMVar20->cstep;
                    sVar10 = pMVar20->elemsize;
                    pvVar24 = pMVar20->data;
                    lVar28 = 0;
                    iVar25 = iVar30;
                    do {
                      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                                 ((long)pvVar24 + lVar28 + sVar8 * sVar10 * uVar19),
                                                auVar35,*(undefined1 (*) [16])
                                                         ((long)pvVar23 + lVar28 + lVar26));
                      *(undefined1 (*) [16])((long)pvVar23 + lVar28 + lVar26) = auVar33;
                      lVar28 = lVar28 + 0x10;
                      iVar25 = iVar25 + -1;
                    } while (iVar25 != 0);
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar19 != uVar22);
                pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 < (ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7));
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)pp_Var9[-3]) != 2) {
        return 0;
      }
      pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)uVar6) {
        uVar21 = 0;
        do {
          if (0 < iVar30) {
            sVar8 = this_00->cstep;
            sVar10 = pMVar20[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar23 = this_00->data;
            sVar12 = pMVar20[1].elemsize;
            pvVar24 = pMVar20[1].data;
            sVar13 = m->cstep;
            sVar14 = m->elemsize;
            pvVar27 = m->data;
            lVar26 = 0;
            iVar25 = iVar30;
            do {
              auVar33 = vmaxps_avx(*(undefined1 (*) [16])
                                    ((long)pvVar27 + lVar26 + sVar13 * sVar14 * uVar21),
                                   *(undefined1 (*) [16])
                                    ((long)pvVar24 + lVar26 + sVar10 * sVar12 * uVar21));
              *(undefined1 (*) [16])((long)pvVar23 + lVar26 + sVar8 * sVar11 * uVar21) = auVar33;
              lVar26 = lVar26 + 0x10;
              iVar25 = iVar25 + -1;
            } while (iVar25 != 0);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar22);
        pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7) < 3) {
        return 0;
      }
      uVar21 = 2;
      do {
        if (0 < (int)uVar6) {
          pMVar20 = pMVar20 + uVar21;
          uVar19 = 0;
          do {
            if (0 < iVar30) {
              lVar26 = this_00->cstep * this_00->elemsize * uVar19;
              pvVar23 = this_00->data;
              sVar8 = pMVar20->cstep;
              sVar10 = pMVar20->elemsize;
              pvVar24 = pMVar20->data;
              lVar28 = 0;
              iVar25 = iVar30;
              do {
                auVar33 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar23 + lVar28 + lVar26),
                                     *(undefined1 (*) [16])
                                      ((long)pvVar24 + lVar28 + sVar8 * sVar10 * uVar19));
                *(undefined1 (*) [16])((long)pvVar23 + lVar28 + lVar26) = auVar33;
                lVar28 = lVar28 + 0x10;
                iVar25 = iVar25 + -1;
              } while (iVar25 != 0);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar22);
          pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < (ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7));
    }
    else if (iVar25 == 8) {
      if (iVar7 == 0) {
        pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (0 < (int)uVar6) {
          uVar21 = 0;
          do {
            if (0 < iVar30) {
              sVar8 = pMVar20[1].cstep;
              sVar10 = m->cstep;
              sVar11 = m->elemsize;
              pvVar23 = m->data;
              sVar12 = pMVar20[1].elemsize;
              pvVar24 = pMVar20[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar27 = this_00->data;
              lVar26 = 0;
              iVar25 = iVar30;
              do {
                pfVar1 = (float *)((long)pvVar24 + lVar26 + sVar8 * sVar12 * uVar21);
                pfVar2 = (float *)((long)pvVar23 + lVar26 + sVar10 * sVar11 * uVar21);
                auVar16._4_4_ = pfVar1[1] * pfVar2[1];
                auVar16._0_4_ = *pfVar1 * *pfVar2;
                auVar16._8_4_ = pfVar1[2] * pfVar2[2];
                auVar16._12_4_ = pfVar1[3] * pfVar2[3];
                auVar16._16_4_ = pfVar1[4] * pfVar2[4];
                auVar16._20_4_ = pfVar1[5] * pfVar2[5];
                auVar16._24_4_ = pfVar1[6] * pfVar2[6];
                auVar16._28_4_ = pfVar1[7];
                *(undefined1 (*) [32])((long)pvVar27 + lVar26 + sVar13 * sVar14 * uVar21) = auVar16;
                lVar26 = lVar26 + 0x20;
                iVar25 = iVar25 + -1;
              } while (iVar25 != 0);
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar22);
          pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        }
        pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (2 < (ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7)) {
          uVar21 = 2;
          do {
            if (0 < (int)uVar6) {
              pMVar20 = pMVar20 + uVar21;
              uVar19 = 0;
              do {
                if (0 < iVar30) {
                  sVar8 = pMVar20->cstep;
                  sVar10 = pMVar20->elemsize;
                  pvVar23 = pMVar20->data;
                  lVar26 = this_00->cstep * this_00->elemsize * uVar19;
                  pvVar24 = this_00->data;
                  lVar28 = 0;
                  iVar25 = iVar30;
                  do {
                    pfVar1 = (float *)((long)pvVar23 + lVar28 + sVar8 * sVar10 * uVar19);
                    pfVar2 = (float *)((long)pvVar24 + lVar28 + lVar26);
                    auVar17._4_4_ = pfVar1[1] * pfVar2[1];
                    auVar17._0_4_ = *pfVar1 * *pfVar2;
                    auVar17._8_4_ = pfVar1[2] * pfVar2[2];
                    auVar17._12_4_ = pfVar1[3] * pfVar2[3];
                    auVar17._16_4_ = pfVar1[4] * pfVar2[4];
                    auVar17._20_4_ = pfVar1[5] * pfVar2[5];
                    auVar17._24_4_ = pfVar1[6] * pfVar2[6];
                    auVar17._28_4_ = pfVar1[7];
                    *(undefined1 (*) [32])((long)pvVar24 + lVar28 + lVar26) = auVar17;
                    lVar28 = lVar28 + 0x20;
                    iVar25 = iVar25 + -1;
                  } while (iVar25 != 0);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar22);
              pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < (ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      p_Var15 = pp_Var9[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var15) == 1) {
        pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(int *)(&this->field_0x104 + (long)p_Var15) == 0) {
          if (0 < (int)uVar6) {
            uVar21 = 0;
            do {
              if (0 < iVar30) {
                sVar8 = pMVar20[1].cstep;
                sVar10 = m->cstep;
                sVar11 = m->elemsize;
                pvVar23 = m->data;
                sVar12 = pMVar20[1].elemsize;
                pvVar24 = pMVar20[1].data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar27 = this_00->data;
                lVar26 = 0;
                iVar25 = iVar30;
                do {
                  pfVar1 = (float *)((long)pvVar24 + lVar26 + sVar8 * sVar12 * uVar21);
                  pfVar2 = (float *)((long)pvVar23 + lVar26 + sVar10 * sVar11 * uVar21);
                  auVar39._0_4_ = *pfVar1 + *pfVar2;
                  auVar39._4_4_ = pfVar1[1] + pfVar2[1];
                  auVar39._8_4_ = pfVar1[2] + pfVar2[2];
                  auVar39._12_4_ = pfVar1[3] + pfVar2[3];
                  auVar39._16_4_ = pfVar1[4] + pfVar2[4];
                  auVar39._20_4_ = pfVar1[5] + pfVar2[5];
                  auVar39._24_4_ = pfVar1[6] + pfVar2[6];
                  auVar39._28_4_ = pfVar1[7] + pfVar2[7];
                  *(undefined1 (*) [32])((long)pvVar27 + lVar26 + sVar13 * sVar14 * uVar21) =
                       auVar39;
                  lVar26 = lVar26 + 0x20;
                  iVar25 = iVar25 + -1;
                } while (iVar25 != 0);
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != uVar22);
            pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          }
          pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          if (2 < (ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7)) {
            uVar21 = 2;
            do {
              if (0 < (int)uVar6) {
                pMVar20 = pMVar20 + uVar21;
                uVar19 = 0;
                do {
                  if (0 < iVar30) {
                    sVar8 = pMVar20->cstep;
                    sVar10 = pMVar20->elemsize;
                    pvVar23 = pMVar20->data;
                    lVar26 = this_00->cstep * this_00->elemsize * uVar19;
                    pvVar24 = this_00->data;
                    lVar28 = 0;
                    iVar25 = iVar30;
                    do {
                      pfVar1 = (float *)((long)pvVar23 + lVar28 + sVar8 * sVar10 * uVar19);
                      pfVar2 = (float *)((long)pvVar24 + lVar28 + lVar26);
                      auVar40._0_4_ = *pfVar1 + *pfVar2;
                      auVar40._4_4_ = pfVar1[1] + pfVar2[1];
                      auVar40._8_4_ = pfVar1[2] + pfVar2[2];
                      auVar40._12_4_ = pfVar1[3] + pfVar2[3];
                      auVar40._16_4_ = pfVar1[4] + pfVar2[4];
                      auVar40._20_4_ = pfVar1[5] + pfVar2[5];
                      auVar40._24_4_ = pfVar1[6] + pfVar2[6];
                      auVar40._28_4_ = pfVar1[7] + pfVar2[7];
                      *(undefined1 (*) [32])((long)pvVar24 + lVar28 + lVar26) = auVar40;
                      lVar28 = lVar28 + 0x20;
                      iVar25 = iVar25 + -1;
                    } while (iVar25 != 0);
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar19 != uVar22);
                pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 < (ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7));
          }
        }
        else {
          if (0 < (int)uVar6) {
            fVar3 = **(float **)(&this->field_0xd8 + (long)p_Var15);
            fVar4 = (*(float **)(&this->field_0xd8 + (long)p_Var15))[1];
            auVar42._4_4_ = fVar4;
            auVar42._0_4_ = fVar4;
            auVar42._8_4_ = fVar4;
            auVar42._12_4_ = fVar4;
            auVar42._16_4_ = fVar4;
            auVar42._20_4_ = fVar4;
            auVar42._24_4_ = fVar4;
            auVar42._28_4_ = fVar4;
            uVar21 = 0;
            do {
              if (0 < iVar30) {
                sVar8 = pMVar20[1].cstep;
                sVar10 = m->cstep;
                sVar11 = m->elemsize;
                pvVar23 = m->data;
                sVar12 = pMVar20[1].elemsize;
                pvVar24 = pMVar20[1].data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar27 = this_00->data;
                lVar26 = 0;
                iVar25 = iVar30;
                do {
                  pfVar1 = (float *)((long)pvVar23 + lVar26 + sVar10 * sVar11 * uVar21);
                  auVar44._0_4_ = fVar3 * *pfVar1;
                  auVar44._4_4_ = fVar3 * pfVar1[1];
                  auVar44._8_4_ = fVar3 * pfVar1[2];
                  auVar44._12_4_ = fVar3 * pfVar1[3];
                  auVar44._16_4_ = fVar3 * pfVar1[4];
                  auVar44._20_4_ = fVar3 * pfVar1[5];
                  auVar44._28_36_ = in_ZMM2._28_36_;
                  auVar44._24_4_ = fVar3 * pfVar1[6];
                  auVar33 = vfmadd231ps_fma(auVar44._0_32_,auVar42,
                                            *(undefined1 (*) [32])
                                             ((long)pvVar24 + lVar26 + sVar8 * sVar12 * uVar21));
                  in_ZMM2 = ZEXT1664(auVar33);
                  *(undefined1 (*) [32])((long)pvVar27 + lVar26 + sVar13 * sVar14 * uVar21) =
                       ZEXT1632(auVar33);
                  lVar26 = lVar26 + 0x20;
                  iVar25 = iVar25 + -1;
                } while (iVar25 != 0);
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != uVar22);
            pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          }
          pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          if (2 < (ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7)) {
            uVar21 = 2;
            do {
              if (0 < (int)uVar6) {
                pMVar20 = pMVar20 + uVar21;
                uVar5 = *(undefined4 *)
                         (*(long *)(&this->field_0xd8 + (long)pp_Var9[-3]) + uVar21 * 4);
                auVar38._4_4_ = uVar5;
                auVar38._0_4_ = uVar5;
                auVar38._8_4_ = uVar5;
                auVar38._12_4_ = uVar5;
                auVar38._16_4_ = uVar5;
                auVar38._20_4_ = uVar5;
                auVar38._24_4_ = uVar5;
                auVar38._28_4_ = uVar5;
                uVar19 = 0;
                do {
                  if (0 < iVar30) {
                    sVar8 = pMVar20->cstep;
                    sVar10 = pMVar20->elemsize;
                    pvVar23 = pMVar20->data;
                    lVar26 = this_00->cstep * this_00->elemsize * uVar19;
                    pvVar24 = this_00->data;
                    lVar28 = 0;
                    iVar25 = iVar30;
                    do {
                      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                                 ((long)pvVar23 + lVar28 + sVar8 * sVar10 * uVar19),
                                                auVar38,*(undefined1 (*) [32])
                                                         ((long)pvVar24 + lVar28 + lVar26));
                      *(undefined1 (*) [32])((long)pvVar24 + lVar28 + lVar26) = ZEXT1632(auVar33);
                      lVar28 = lVar28 + 0x20;
                      iVar25 = iVar25 + -1;
                    } while (iVar25 != 0);
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar19 != uVar22);
                pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 < (ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7));
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)pp_Var9[-3]) != 2) {
        return 0;
      }
      pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)uVar6) {
        uVar21 = 0;
        do {
          if (0 < iVar30) {
            sVar8 = pMVar20[1].cstep;
            sVar10 = m->cstep;
            sVar11 = m->elemsize;
            pvVar23 = m->data;
            sVar12 = pMVar20[1].elemsize;
            pvVar24 = pMVar20[1].data;
            sVar13 = this_00->cstep;
            sVar14 = this_00->elemsize;
            pvVar27 = this_00->data;
            lVar26 = 0;
            iVar25 = iVar30;
            do {
              auVar16 = vmaxps_avx(*(undefined1 (*) [32])
                                    ((long)pvVar23 + lVar26 + sVar10 * sVar11 * uVar21),
                                   *(undefined1 (*) [32])
                                    ((long)pvVar24 + lVar26 + sVar8 * sVar12 * uVar21));
              *(undefined1 (*) [32])((long)pvVar27 + lVar26 + sVar13 * sVar14 * uVar21) = auVar16;
              lVar26 = lVar26 + 0x20;
              iVar25 = iVar25 + -1;
            } while (iVar25 != 0);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar22);
        pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7) < 3) {
        return 0;
      }
      uVar21 = 2;
      do {
        if (0 < (int)uVar6) {
          pMVar20 = pMVar20 + uVar21;
          uVar19 = 0;
          do {
            if (0 < iVar30) {
              sVar8 = pMVar20->cstep;
              sVar10 = pMVar20->elemsize;
              pvVar23 = pMVar20->data;
              lVar26 = this_00->cstep * this_00->elemsize * uVar19;
              pvVar24 = this_00->data;
              lVar28 = 0;
              iVar25 = iVar30;
              do {
                auVar16 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar24 + lVar28 + lVar26),
                                     *(undefined1 (*) [32])
                                      ((long)pvVar23 + lVar28 + sVar8 * sVar10 * uVar19));
                *(undefined1 (*) [32])((long)pvVar24 + lVar28 + lVar26) = auVar16;
                lVar28 = lVar28 + 0x20;
                iVar25 = iVar25 + -1;
              } while (iVar25 != 0);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar22);
          pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < (ulong)(((long)pMVar18 - (long)pMVar20 >> 3) * -0x71c71c71c71c71c7));
    }
    else {
      if (iVar7 == 0) {
        pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (0 < (int)uVar6) {
          pvVar24 = m->data;
          sVar10 = m->cstep;
          pvVar27 = pMVar20[1].data;
          sVar11 = pMVar20[1].cstep;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar20[1].elemsize;
          sVar14 = m->elemsize;
          uVar21 = 0;
          do {
            if (0 < iVar30) {
              lVar26 = 0;
              uVar31 = iVar30 + 1;
              do {
                *(float *)((long)pvVar23 + lVar26) =
                     *(float *)((long)pvVar27 + lVar26) * *(float *)((long)pvVar24 + lVar26);
                uVar31 = uVar31 - 1;
                lVar26 = lVar26 + 4;
              } while (1 < uVar31);
            }
            uVar21 = uVar21 + 1;
            pvVar23 = (void *)((long)pvVar23 + sVar12 * sVar8);
            pvVar27 = (void *)((long)pvVar27 + sVar11 * sVar13);
            pvVar24 = (void *)((long)pvVar24 + sVar10 * sVar14);
          } while (uVar21 != uVar22);
        }
        uVar21 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar20 >> 3) *
                 -0x71c71c71c71c71c7;
        if (2 < uVar21) {
          uVar19 = 2;
          do {
            if (0 < (int)uVar6) {
              pvVar23 = pMVar20[uVar19].data;
              sVar10 = pMVar20[uVar19].cstep;
              sVar11 = pMVar20[uVar19].elemsize;
              pvVar24 = this_00->data;
              sVar12 = this_00->elemsize;
              uVar29 = 0;
              do {
                if (0 < iVar30) {
                  lVar26 = 0;
                  uVar31 = iVar30 + 1;
                  do {
                    *(float *)((long)pvVar24 + lVar26) =
                         *(float *)((long)pvVar24 + lVar26) * *(float *)((long)pvVar23 + lVar26);
                    uVar31 = uVar31 - 1;
                    lVar26 = lVar26 + 4;
                  } while (1 < uVar31);
                }
                uVar29 = uVar29 + 1;
                pvVar24 = (void *)((long)pvVar24 + sVar12 * sVar8);
                pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar11);
              } while (uVar29 != uVar22);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar21);
        }
      }
      p_Var15 = pp_Var9[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var15) == 1) {
        if (*(int *)(&this->field_0x104 + (long)p_Var15) == 0) {
          pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)uVar6) {
            pvVar23 = m->data;
            sVar10 = m->cstep;
            pvVar24 = pMVar20[1].data;
            sVar11 = pMVar20[1].cstep;
            pvVar27 = this_00->data;
            sVar12 = this_00->elemsize;
            sVar13 = pMVar20[1].elemsize;
            sVar14 = m->elemsize;
            uVar21 = 0;
            do {
              if (0 < iVar30) {
                lVar26 = 0;
                uVar31 = iVar30 + 1;
                do {
                  *(float *)((long)pvVar27 + lVar26) =
                       *(float *)((long)pvVar24 + lVar26) + *(float *)((long)pvVar23 + lVar26);
                  uVar31 = uVar31 - 1;
                  lVar26 = lVar26 + 4;
                } while (1 < uVar31);
              }
              uVar21 = uVar21 + 1;
              pvVar27 = (void *)((long)pvVar27 + sVar12 * sVar8);
              pvVar24 = (void *)((long)pvVar24 + sVar11 * sVar13);
              pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar14);
            } while (uVar21 != uVar22);
          }
          uVar21 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar20 >> 3) *
                   -0x71c71c71c71c71c7;
          if (2 < uVar21) {
            uVar19 = 2;
            do {
              if (0 < (int)uVar6) {
                pvVar23 = pMVar20[uVar19].data;
                sVar10 = pMVar20[uVar19].cstep;
                sVar11 = pMVar20[uVar19].elemsize;
                pvVar24 = this_00->data;
                sVar12 = this_00->elemsize;
                uVar29 = 0;
                do {
                  if (0 < iVar30) {
                    lVar26 = 0;
                    uVar31 = iVar30 + 1;
                    do {
                      *(float *)((long)pvVar24 + lVar26) =
                           *(float *)((long)pvVar24 + lVar26) + *(float *)((long)pvVar23 + lVar26);
                      uVar31 = uVar31 - 1;
                      lVar26 = lVar26 + 4;
                    } while (1 < uVar31);
                  }
                  uVar29 = uVar29 + 1;
                  pvVar24 = (void *)((long)pvVar24 + sVar12 * sVar8);
                  pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar11);
                } while (uVar29 != uVar22);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar21);
          }
        }
        else {
          pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)uVar6) {
            fVar3 = **(float **)(&this->field_0xd8 + (long)p_Var15);
            fVar4 = (*(float **)(&this->field_0xd8 + (long)p_Var15))[1];
            pvVar23 = m->data;
            sVar10 = m->cstep;
            pvVar24 = pMVar20[1].data;
            sVar11 = pMVar20[1].cstep;
            pvVar27 = this_00->data;
            sVar12 = this_00->elemsize;
            sVar13 = pMVar20[1].elemsize;
            sVar14 = m->elemsize;
            uVar21 = 0;
            do {
              if (0 < iVar30) {
                lVar26 = 0;
                uVar31 = iVar30 + 1;
                do {
                  auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * *(float *)((long)pvVar23 + lVar26
                                                                             ))),
                                            ZEXT416((uint)fVar4),
                                            ZEXT416(*(uint *)((long)pvVar24 + lVar26)));
                  *(int *)((long)pvVar27 + lVar26) = auVar33._0_4_;
                  uVar31 = uVar31 - 1;
                  lVar26 = lVar26 + 4;
                } while (1 < uVar31);
              }
              uVar21 = uVar21 + 1;
              pvVar27 = (void *)((long)pvVar27 + sVar12 * sVar8);
              pvVar24 = (void *)((long)pvVar24 + sVar11 * sVar13);
              pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar14);
            } while (uVar21 != uVar22);
          }
          uVar21 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar20 >> 3) *
                   -0x71c71c71c71c71c7;
          if (2 < uVar21) {
            uVar19 = 2;
            do {
              if (0 < (int)uVar6) {
                uVar31 = *(uint *)(*(long *)(&this->field_0xd8 + (long)pp_Var9[-3]) + uVar19 * 4);
                pvVar23 = pMVar20[uVar19].data;
                sVar10 = pMVar20[uVar19].cstep;
                sVar11 = pMVar20[uVar19].elemsize;
                pvVar24 = this_00->data;
                sVar12 = this_00->elemsize;
                uVar29 = 0;
                do {
                  if (0 < iVar30) {
                    lVar26 = 0;
                    uVar32 = iVar30 + 1;
                    do {
                      auVar33 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pvVar23 + lVar26)),
                                                ZEXT416(uVar31),
                                                ZEXT416(*(uint *)((long)pvVar24 + lVar26)));
                      *(int *)((long)pvVar24 + lVar26) = auVar33._0_4_;
                      uVar32 = uVar32 - 1;
                      lVar26 = lVar26 + 4;
                    } while (1 < uVar32);
                  }
                  uVar29 = uVar29 + 1;
                  pvVar24 = (void *)((long)pvVar24 + sVar12 * sVar8);
                  pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar11);
                } while (uVar29 != uVar22);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar21);
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)pp_Var9[-3]) != 2) {
        return 0;
      }
      pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)uVar6) {
        pvVar23 = m->data;
        sVar10 = m->cstep;
        pvVar24 = pMVar20[1].data;
        sVar11 = pMVar20[1].cstep;
        pvVar27 = this_00->data;
        sVar12 = this_00->elemsize;
        sVar13 = pMVar20[1].elemsize;
        sVar14 = m->elemsize;
        uVar21 = 0;
        do {
          if (0 < iVar30) {
            lVar26 = 0;
            uVar31 = iVar30 + 1;
            do {
              auVar33 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar24 + lVar26)),
                                   ZEXT416(*(uint *)((long)pvVar23 + lVar26)));
              *(int *)((long)pvVar27 + lVar26) = auVar33._0_4_;
              uVar31 = uVar31 - 1;
              lVar26 = lVar26 + 4;
            } while (1 < uVar31);
          }
          uVar21 = uVar21 + 1;
          pvVar27 = (void *)((long)pvVar27 + sVar12 * sVar8);
          pvVar24 = (void *)((long)pvVar24 + sVar11 * sVar13);
          pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar14);
        } while (uVar21 != uVar22);
      }
      uVar21 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar20 >> 3) *
               -0x71c71c71c71c71c7;
      if (uVar21 < 3) {
        return 0;
      }
      uVar19 = 2;
      do {
        if (0 < (int)uVar6) {
          pvVar23 = pMVar20[uVar19].data;
          sVar10 = pMVar20[uVar19].cstep;
          sVar11 = pMVar20[uVar19].elemsize;
          pvVar24 = this_00->data;
          sVar12 = this_00->elemsize;
          uVar29 = 0;
          do {
            if (0 < iVar30) {
              lVar26 = 0;
              uVar31 = iVar30 + 1;
              do {
                auVar33 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar24 + lVar26)),
                                     ZEXT416(*(uint *)((long)pvVar23 + lVar26)));
                *(int *)((long)pvVar24 + lVar26) = auVar33._0_4_;
                uVar31 = uVar31 - 1;
                lVar26 = lVar26 + 4;
              } while (1 < uVar31);
            }
            uVar29 = uVar29 + 1;
            pvVar24 = (void *)((long)pvVar24 + sVar12 * sVar8);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar11);
          } while (uVar29 != uVar22);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar21);
    }
    return 0;
  }
  return -100;
}

Assistant:

int Eltwise_x86_avx2::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_add_ps(_p, _p1);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m256 _coeff0 = _mm256_set1_ps(coeffs[0]);
                __m256 _coeff1 = _mm256_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_mul_ps(_p, _coeff0);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff1, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m256 _coeff = _mm256_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_comp_fmadd_ps(_p1, _coeff, _p);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_max_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p = _mm_load_ps(outptr);
                            __m128 _p1 = _mm_load_ps(ptr);
                            _p = _mm_add_ps(_p, _p1);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m128 _coeff0 = _mm_set1_ps(coeffs[0]);
                __m128 _coeff1 = _mm_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_mul_ps(_p, _coeff0);
                        _p1 = _mm_mul_ps(_p1, _coeff1);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m128 _coeff = _mm_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p1 = _mm_load_ps(ptr);
                            __m128 _p = _mm_load_ps(outptr);
                            _p1 = _mm_mul_ps(_p1, _coeff);
                            _p = _mm_add_ps(_p1, _p);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_max_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}